

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_quaternion rf_quaternion_transform(rf_quaternion q,rf_mat mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  rf_quaternion rVar5;
  
  fVar1 = q.x;
  fVar2 = q.y;
  fVar3 = q.z;
  fVar4 = q.w;
  rVar5.x = fVar1 * mat.m0 + mat.m4 * fVar2 + fVar3 * mat.m8 + mat.m12 * fVar4;
  rVar5.y = fVar1 * mat.m1 + mat.m5 * fVar2 + fVar3 * mat.m9 + mat.m13 * fVar4;
  rVar5.w = fVar1 * mat.m3 + mat.m7 * fVar2 + fVar3 * mat.m11 + mat.m15 * fVar4;
  rVar5.z = fVar1 * mat.m2 + mat.m6 * fVar2 + fVar3 * mat.m10 + mat.m14 * fVar4;
  return rVar5;
}

Assistant:

RF_API rf_quaternion rf_quaternion_transform(rf_quaternion q, rf_mat mat)
{
    rf_quaternion result = {0};

    result.x = mat.m0 * q.x + mat.m4 * q.y + mat.m8 * q.z + mat.m12 * q.w;
    result.y = mat.m1 * q.x + mat.m5 * q.y + mat.m9 * q.z + mat.m13 * q.w;
    result.z = mat.m2 * q.x + mat.m6 * q.y + mat.m10 * q.z + mat.m14 * q.w;
    result.w = mat.m3 * q.x + mat.m7 * q.y + mat.m11 * q.z + mat.m15 * q.w;

    return result;
}